

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_e23c::MovieState::MovieState(MovieState *this,string *fname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  
  (this->mIOContext)._M_t.
  super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
  super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
  super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl = (AVIOContext *)0x0;
  (this->mFormatCtx)._M_t.
  super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
  super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
  super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl = (AVFormatContext *)0x0;
  this->mAVSyncType = Default;
  (this->mClockBase).__r = -0x8000000000000000;
  (this->mQuit)._M_base._M_i = false;
  (this->mAudio).mMovie = this;
  (this->mAudio).mStream = (AVStream *)0x0;
  (this->mAudio).mCodecCtx._M_t.
  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
  super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl = (AVCodecContext *)0x0;
  (this->mAudio).mPackets.mMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mAudio).mPackets.mMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mAudio).mPackets.mMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mAudio).mPackets.mMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mAudio).mPackets.mMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->mAudio).mPackets.mCondVar);
  *(_Elt_pointer *)
   ((long)&(this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  (this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->mAudio).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<AVPacket,_std::allocator<AVPacket>_>::_M_initialize_map
            (&(this->mAudio).mPackets.mPackets.
              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>,0);
  (this->mAudio).mPackets.mTotalSize = 0;
  (this->mAudio).mPackets.mFinished = false;
  (this->mAudio).mClockDiffAvg.__r = 0.0;
  (this->mAudio).mCurrentPts.__r = 0;
  (this->mAudio).mDeviceStartTime.__r = -0x8000000000000000;
  (this->mAudio).mDecodedFrame._M_t.
  super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
  super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
  super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl = (AVFrame *)0x0;
  (this->mAudio).mSwresCtx._M_t.
  super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>._M_t.
  super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
  super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl = (SwrContext *)0x0;
  (this->mAudio).mDstChanLayout = 0;
  (this->mAudio).mDstSampleFmt = AV_SAMPLE_FMT_NONE;
  (this->mAudio).mSamples = (uint8_t *)0x0;
  (this->mAudio).mSamplesLen = 0;
  (this->mAudio).mSamplesPos = 0;
  (this->mAudio).mSamplesMax = 0;
  (this->mAudio).mBufferData._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  (this->mAudio).mBufferDataSize = 0;
  (this->mAudio).mReadPos.super___atomic_base<unsigned_long>._M_i = 0;
  (this->mAudio).mWritePos.super___atomic_base<unsigned_long>._M_i = 0;
  (this->mAudio).mFormat = 0;
  (this->mAudio).mFrameSize = 0;
  (this->mAudio).mSrcMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mAudio).mSrcMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mAudio).mSrcMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mAudio).mSrcMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mAudio).mSrcMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->mAudio).mSrcCond);
  memset(&(this->mAudio).mSource,0,0xa8);
  LOCK();
  (this->mAudio).mConnected.super___atomic_flag_base._M_i = true;
  UNLOCK();
  (this->mVideo).mMovie = this;
  (this->mVideo).mStream = (AVStream *)0x0;
  (this->mVideo).mCodecCtx._M_t.
  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
  super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl = (AVCodecContext *)0x0;
  (this->mVideo).mPackets.mMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mVideo).mPackets.mMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mVideo).mPackets.mMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mVideo).mPackets.mMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mVideo).mPackets.mMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->mVideo).mPackets.mCondVar);
  *(_Elt_pointer *)
   ((long)&(this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  (this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<AVPacket,_std::allocator<AVPacket>_>::_M_initialize_map
            (&(this->mVideo).mPackets.mPackets.
              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>,0);
  lVar5 = 0;
  (this->mVideo).mPackets.mTotalSize = 0;
  (this->mVideo).mPackets.mFinished = false;
  (this->mVideo).mDisplayPts.__r = 0;
  (this->mVideo).mDisplayPtsTime.__r = -0x8000000000000000;
  (this->mVideo).mDispPtsMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mVideo).mDispPtsMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mVideo).mDispPtsMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mVideo).mDispPtsMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mVideo).mDispPtsMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mVideo).mSwscaleCtx._M_t.
  super___uniq_ptr_impl<SwsContext,_(anonymous_namespace)::SwsContextDeleter>._M_t.
  super__Tuple_impl<0UL,_SwsContext_*,_(anonymous_namespace)::SwsContextDeleter>.
  super__Head_base<0UL,_SwsContext_*,_false>._M_head_impl = (SwsContext *)0x0;
  do {
    *(undefined8 *)
     ((long)&(this->mVideo).mPictQ._M_elems[0].mFrame._M_t.
             super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t + lVar5) = 0
    ;
    *(undefined8 *)((long)&(this->mVideo).mPictQ._M_elems[0].mPts.__r + lVar5) = 0x8000000000000000;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x180);
  (this->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i = 0;
  (this->mVideo).mPictQWrite.super___atomic_base<unsigned_long>._M_i = 1;
  (this->mVideo).mPictQMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mVideo).mPictQMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mVideo).mPictQMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mVideo).mPictQMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mVideo).mPictQMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->mVideo).mPictQCond);
  (this->mVideo).mImage = (SDL_Texture *)0x0;
  (this->mVideo).mWidth = 0;
  (this->mVideo).mHeight = 0;
  (this->mVideo).mFirstUpdate = true;
  (this->mVideo).mEOS = (__atomic_base<bool>)0x0;
  (this->mVideo).mFinalUpdate._M_base._M_i = false;
  paVar2 = &(this->mFilename).field_2;
  (this->mParseThread)._M_id._M_thread = 0;
  (this->mAudioThread)._M_id._M_thread = 0;
  (this->mVideoThread)._M_id._M_thread = 0;
  (this->mFilename)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (fname->_M_dataplus)._M_p;
  paVar1 = &fname->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&fname->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mFilename).field_2 + 8) = uVar4;
  }
  else {
    (this->mFilename)._M_dataplus._M_p = pcVar3;
    (this->mFilename).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->mFilename)._M_string_length = fname->_M_string_length;
  (fname->_M_dataplus)._M_p = (pointer)paVar1;
  fname->_M_string_length = 0;
  (fname->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

MovieState(std::string fname)
      : mAudio(*this), mVideo(*this), mFilename(std::move(fname))
    { }